

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

xmlDictEntry *
xmlDictLookupInternal(xmlDictPtr dict,xmlChar *prefix,xmlChar *name,int maybeLen,int update)

{
  _xmlDict *p_Var1;
  xmlChar *pxVar2;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  xmlDictEntry *__src;
  xmlChar *pxVar6;
  uint uVar7;
  ulong uVar8;
  xmlDictEntry *pxVar9;
  uint uVar10;
  xmlDictEntry *pxVar11;
  xmlDictEntry *pxVar12;
  int found;
  size_t len;
  size_t plen;
  int local_58;
  uint local_54;
  uint local_50;
  undefined4 uStack_4c;
  uint local_48;
  undefined4 uStack_44;
  uint local_3c;
  _xmlDict *local_38;
  
  local_58 = 0;
  if (name != (xmlChar *)0x0 && dict != (xmlDictPtr)0x0) {
    if (prefix == (xmlChar *)0x0) {
      iVar5 = -1;
      if (-1 < maybeLen) {
        iVar5 = maybeLen;
      }
      uVar4 = xmlDictHashName(dict->seed,name,(long)iVar5,(size_t *)&local_50);
      pxVar11 = (xmlDictEntry *)CONCAT44(uStack_4c,local_50);
      if ((xmlDictEntry *)&DAT_40000000 <= pxVar11) {
        return (xmlDictEntry *)0x0;
      }
    }
    else {
      uVar4 = xmlDictHashQName(dict->seed,prefix,name,(size_t *)&local_48,(size_t *)&local_50);
      uVar8 = CONCAT44(uStack_4c,local_50);
      if (0x3fffffff < uVar8) {
        return (xmlDictEntry *)0x0;
      }
      if (0x3fffffff - uVar8 <= CONCAT44(uStack_44,local_48)) {
        return (xmlDictEntry *)0x0;
      }
      pxVar11 = (xmlDictEntry *)(uVar8 + CONCAT44(uStack_44,local_48) + 1);
    }
    if (pxVar11 <= (xmlDictEntry *)(dict->limit - 1)) {
      if (dict->size == 0) {
        uVar7 = 8;
        __src = (xmlDictEntry *)0x0;
      }
      else {
        __src = xmlDictFindEntry(dict,prefix,name,(int)pxVar11,uVar4,&local_58);
        if (local_58 != 0) {
          return __src;
        }
        uVar8 = dict->size;
        uVar7 = 0;
        if ((uVar8 & 0xfffffffffffffff8) - (uVar8 >> 3) < (ulong)(dict->nbElems + 1)) {
          if (0x7fffffff < uVar8) {
            return (xmlDictEntry *)0x0;
          }
          uVar7 = (int)uVar8 * 2;
        }
      }
      p_Var1 = dict->subdict;
      local_54 = uVar4;
      if ((p_Var1 != (_xmlDict *)0x0) && (p_Var1->size != 0)) {
        local_3c = uVar7;
        local_38 = p_Var1;
        if (prefix == (xmlChar *)0x0) {
          uVar4 = xmlDictHashName(p_Var1->seed,name,CONCAT44(uStack_4c,local_50),(size_t *)&local_50
                                 );
        }
        else {
          uVar4 = xmlDictHashQName(p_Var1->seed,prefix,name,(size_t *)&local_48,(size_t *)&local_50)
          ;
        }
        pxVar11 = xmlDictFindEntry(local_38,prefix,name,(int)pxVar11,uVar4,&local_58);
        uVar7 = local_3c;
        if (local_58 != 0) {
          return pxVar11;
        }
      }
      if (update != 0) {
        if (uVar7 != 0) {
          iVar5 = xmlDictGrow(dict,uVar7);
          if (iVar5 == 0) {
            uVar7 = (int)dict->size - 1;
            uVar8 = (ulong)(uVar7 & local_54);
            pxVar9 = dict->table;
            __src = pxVar9 + uVar8;
            uVar4 = pxVar9[uVar8].hashValue;
            if (uVar4 != 0) {
              uVar10 = 0;
              do {
                if (((int)uVar8 - uVar4 & uVar7) < uVar10) break;
                uVar10 = uVar10 + 1;
                uVar4 = (int)uVar8 + 1;
                uVar8 = (ulong)uVar4;
                __src = __src + 1;
                if ((uVar4 & uVar7) == 0) {
                  __src = pxVar9;
                }
                uVar4 = __src->hashValue;
              } while (uVar4 != 0);
            }
          }
          else {
            pxVar11 = (xmlDictEntry *)0x0;
          }
          if (iVar5 != 0) {
            return pxVar11;
          }
        }
        if (prefix == (xmlChar *)0x0) {
          pxVar6 = xmlDictAddString(dict,name,local_50);
        }
        else {
          pxVar6 = xmlDictAddQString(dict,prefix,local_48,name,local_50);
        }
        if (pxVar6 != (xmlChar *)0x0) {
          if (__src->hashValue != 0) {
            pxVar11 = dict->table;
            pxVar12 = pxVar11 + dict->size;
            pxVar9 = __src;
            do {
              pxVar9 = pxVar9 + 1;
              if (pxVar12 <= pxVar9) {
                pxVar9 = pxVar11;
              }
            } while (pxVar9->hashValue != 0);
            if (pxVar9 < __src) {
              memmove(pxVar11 + 1,pxVar11,(long)pxVar9 - (long)pxVar11);
              pxVar11 = dict->table;
              uVar3 = *(undefined4 *)&pxVar12[-1].field_0x4;
              pxVar2 = pxVar12[-1].name;
              pxVar9 = pxVar12 + -1;
              pxVar11->hashValue = pxVar12[-1].hashValue;
              *(undefined4 *)&pxVar11->field_0x4 = uVar3;
              pxVar11->name = pxVar2;
            }
            memmove(__src + 1,__src,(long)pxVar9 - (long)__src);
          }
          __src->hashValue = local_54;
          __src->name = pxVar6;
          dict->nbElems = dict->nbElems + 1;
          return __src;
        }
      }
    }
  }
  return (xmlDictEntry *)0x0;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static const xmlDictEntry *
xmlDictLookupInternal(xmlDictPtr dict, const xmlChar *prefix,
                      const xmlChar *name, int maybeLen, int update) {
    xmlDictEntry *entry = NULL;
    const xmlChar *ret;
    unsigned hashValue, newSize;
    size_t maxLen, len, plen, klen;
    int found = 0;

    if ((dict == NULL) || (name == NULL))
	return(NULL);

    maxLen = (maybeLen < 0) ? SIZE_MAX : (size_t) maybeLen;

    if (prefix == NULL) {
        hashValue = xmlDictHashName(dict->seed, name, maxLen, &len);
        if (len > INT_MAX / 2)
            return(NULL);
        klen = len;
    } else {
        hashValue = xmlDictHashQName(dict->seed, prefix, name, &plen, &len);
        if ((len > INT_MAX / 2) || (plen >= INT_MAX / 2 - len))
            return(NULL);
        klen = plen + 1 + len;
    }

    if ((dict->limit > 0) && (klen >= dict->limit))
        return(NULL);

    /*
     * Check for an existing entry
     */
    if (dict->size == 0) {
        newSize = MIN_HASH_SIZE;
    } else {
        entry = xmlDictFindEntry(dict, prefix, name, klen, hashValue, &found);
        if (found)
            return(entry);

        if (dict->nbElems + 1 > dict->size / MAX_FILL_DENOM * MAX_FILL_NUM) {
            if (dict->size >= MAX_HASH_SIZE)
                return(NULL);
            newSize = dict->size * 2;
        } else {
            newSize = 0;
        }
    }

    if ((dict->subdict != NULL) && (dict->subdict->size > 0)) {
        xmlDictEntry *subEntry;
        unsigned subHashValue;

        if (prefix == NULL)
            subHashValue = xmlDictHashName(dict->subdict->seed, name, len,
                                           &len);
        else
            subHashValue = xmlDictHashQName(dict->subdict->seed, prefix, name,
                                            &plen, &len);
        subEntry = xmlDictFindEntry(dict->subdict, prefix, name, klen,
                                    subHashValue, &found);
        if (found)
            return(subEntry);
    }

    if (!update)
        return(NULL);

    /*
     * Grow the hash table if needed
     */
    if (newSize > 0) {
        unsigned mask, displ, pos;

        if (xmlDictGrow(dict, newSize) != 0)
            return(NULL);

        /*
         * Find new entry
         */
        mask = dict->size - 1;
        displ = 0;
        pos = hashValue & mask;
        entry = &dict->table[pos];

        while ((entry->hashValue != 0) &&
               ((pos - entry->hashValue) & mask) >= displ) {
            displ++;
            pos++;
            entry++;
            if ((pos & mask) == 0)
                entry = dict->table;
        }
    }

    if (prefix == NULL)
        ret = xmlDictAddString(dict, name, len);
    else
        ret = xmlDictAddQString(dict, prefix, plen, name, len);
    if (ret == NULL)
        return(NULL);

    /*
     * Shift the remainder of the probe sequence to the right
     */
    if (entry->hashValue != 0) {
        const xmlDictEntry *end = &dict->table[dict->size];
        const xmlDictEntry *cur = entry;

        do {
            cur++;
            if (cur >= end)
                cur = dict->table;
        } while (cur->hashValue != 0);

        if (cur < entry) {
            /*
             * If we traversed the end of the buffer, handle the part
             * at the start of the buffer.
             */
            memmove(&dict->table[1], dict->table,
                    (char *) cur - (char *) dict->table);
            cur = end - 1;
            dict->table[0] = *cur;
        }

        memmove(&entry[1], entry, (char *) cur - (char *) entry);
    }

    /*
     * Populate entry
     */
    entry->hashValue = hashValue;
    entry->name = ret;

    dict->nbElems++;

    return(entry);
}